

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode
deleteOneWayReference
          (UA_Server *server,UA_Session *session,UA_Node *node,UA_DeleteReferencesItem *item)

{
  UA_ReferenceNode *p;
  size_t *psVar1;
  UA_Boolean UVar2;
  UA_ReferenceNode *pUVar3;
  undefined8 *puVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  byte bVar9;
  
  bVar9 = 0;
  sVar5 = node->referencesSize;
  lVar6 = sVar5 * 0x50;
  do {
    do {
      lVar7 = lVar6;
      lVar6 = lVar7 + -0x50;
      bVar8 = sVar5 == 0;
      sVar5 = sVar5 - 1;
      if (bVar8) {
        return 0x40bc0000;
      }
      pUVar3 = node->references;
      UVar2 = UA_NodeId_equal(&(item->targetNodeId).nodeId,
                              (UA_NodeId *)
                              ((long)&pUVar3[-1].targetId.nodeId.namespaceIndex + lVar7));
    } while (!UVar2);
    p = (UA_ReferenceNode *)((long)&pUVar3[-1].referenceTypeId.namespaceIndex + lVar7);
    UVar2 = UA_NodeId_equal(&item->referenceTypeId,(UA_NodeId *)p);
  } while ((!UVar2) || (item->isForward == (&pUVar3[-1].isInverse)[lVar7]));
  UA_ReferenceNode_deleteMembers(p);
  pUVar3 = node->references + (node->referencesSize - 1);
  puVar4 = (undefined8 *)((long)&node->references[-1].referenceTypeId.namespaceIndex + lVar7);
  for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar4 = *(undefined8 *)&pUVar3->referenceTypeId;
    pUVar3 = (UA_ReferenceNode *)((long)pUVar3 + (ulong)bVar9 * -0x10 + 8);
    puVar4 = puVar4 + (ulong)bVar9 * -2 + 1;
  }
  psVar1 = &node->referencesSize;
  *psVar1 = *psVar1 - 1;
  if ((*psVar1 == 0) && (node->references != (UA_ReferenceNode *)0x0)) {
    free(node->references);
    node->references = (UA_ReferenceNode *)0x0;
  }
  return 0;
}

Assistant:

static UA_StatusCode
deleteOneWayReference(UA_Server *server, UA_Session *session, UA_Node *node,
                      const UA_DeleteReferencesItem *item) {
    UA_Boolean edited = false;
    for(size_t i = node->referencesSize; i > 0; --i) {
        UA_ReferenceNode *ref = &node->references[i-1];
        if(!UA_NodeId_equal(&item->targetNodeId.nodeId, &ref->targetId.nodeId))
            continue;
        if(!UA_NodeId_equal(&item->referenceTypeId, &ref->referenceTypeId))
            continue;
        if(item->isForward == ref->isInverse)
            continue;
        UA_ReferenceNode_deleteMembers(ref);
        /* move the last entry to override the current position */
        node->references[i-1] = node->references[node->referencesSize-1];
        --node->referencesSize;
        edited = true;
        break;
    }
    if(!edited)
        return UA_STATUSCODE_UNCERTAINREFERENCENOTDELETED;
    /* we removed the last reference */
    if(node->referencesSize == 0 && node->references) {
        UA_free(node->references);
        node->references = NULL;
    }
    return UA_STATUSCODE_GOOD;;
}